

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

double __thiscall QStringView::toDouble(QStringView *this,bool *ok)

{
  long in_FS_OFFSET;
  double dVar1;
  QStringView QVar2;
  QSimpleParsedNumber<double> QVar3;
  QVarLengthArray<unsigned_char,_256LL> latin1;
  storage_type_conflict *in_stack_fffffffffffffeb8;
  QVarLengthArray<unsigned_char,_256LL> local_140;
  long local_28;
  qsizetype asize;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2.m_data = in_stack_fffffffffffffeb8;
  QVar2.m_size = 0x2f5955;
  QVar2 = anon_unknown.dwarf_bb6601::qt_trimmed<QStringView>(QVar2);
  asize = QVar2.m_size;
  memset(&local_140,0xaa,0x118);
  QVarLengthArray<unsigned_char,_256LL>::QVarLengthArray(&local_140,asize);
  qt_to_latin1((uchar *)local_140.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr,QVar2.m_data,
               asize);
  QVar3 = qt_asciiToDouble((char *)local_140.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr,
                           asize,TrailingJunkProhibited);
  dVar1 = QVar3.result;
  if (ok != (bool *)0x0) {
    *ok = 0 < QVar3.used;
  }
  QVarLengthArray<unsigned_char,_256LL>::~QVarLengthArray(&local_140);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return dVar1;
  }
  __stack_chk_fail();
}

Assistant:

double QStringView::toDouble(bool *ok) const
{
    QStringView string = qt_trimmed(*this);
    QVarLengthArray<uchar> latin1(string.size());
    qt_to_latin1(latin1.data(), string.utf16(), string.size());
    auto r = qt_asciiToDouble(reinterpret_cast<const char *>(latin1.data()), string.size());
    if (ok != nullptr)
        *ok = r.ok();
    return r.result;
}